

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O2

void calc_mean_and_sd_weighted<double,int,std::vector<double,std::allocator<double>>,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean,vector<double,_std::allocator<double>_> *w
               )

{
  int *piVar1;
  ulong *puVar2;
  double __x;
  int iVar3;
  bool bVar4;
  long lVar5;
  unsigned_long *puVar6;
  int *piVar7;
  long lVar8;
  size_t row;
  double dVar9;
  double __z;
  ulong uVar10;
  double local_c0;
  double local_b8;
  double local_98;
  
  lVar8 = (long)Xc_indptr[col_num];
  lVar5 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  piVar1 = Xc_ind + lVar5;
  iVar3 = piVar1[-1];
  puVar2 = ix_arr + end + 1;
  puVar6 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,puVar2);
  local_c0 = 0.0;
  for (; st <= end; st = st + 1) {
    local_c0 = local_c0 +
               (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[ix_arr[st]];
  }
  local_b8 = 0.0;
  local_98 = 0.0;
  __z = 0.0;
LAB_0016a69d:
  piVar7 = Xc_ind + lVar8;
  do {
    if (((puVar6 == puVar2) || (lVar8 == lVar5)) || (uVar10 = *puVar6, (ulong)(long)iVar3 < uVar10))
    {
LAB_0016a851:
      dVar9 = 0.0;
      if ((local_b8 != 0.0) || (NAN(local_b8))) {
        if (local_b8 < local_c0) {
          __z = __z + (1.0 - local_b8 / local_c0) * local_b8 * local_98 * local_98;
          local_98 = local_98 * (local_b8 / local_c0);
        }
        *x_mean = local_98;
        dVar9 = SQRT(__z / local_c0);
      }
      else {
        *x_mean = 0.0;
      }
      *x_sd = dVar9;
      return;
    }
    if (*piVar7 == (int)uVar10) {
      dVar9 = Xc[lVar8];
      __x = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_start[uVar10];
      if ((ulong)ABS(dVar9) < 0x7ff0000000000000) {
        bVar4 = local_b8 == 0.0;
        uVar10 = ~-(ulong)bVar4 & (ulong)local_98;
        local_b8 = local_b8 + __x;
        local_98 = fma(__x,(dVar9 - local_98) / local_b8,local_98);
        __z = fma(__x,(dVar9 - (double)(uVar10 | -(ulong)bVar4 & (ulong)dVar9)) * (dVar9 - local_98)
                  ,__z);
      }
      else {
        local_c0 = local_c0 - __x;
      }
      if ((puVar6 == ix_arr + end) || (lVar8 == lVar5 + -1)) goto LAB_0016a851;
      puVar6 = puVar6 + 1;
      piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (piVar7 + 1,piVar1,puVar6);
      lVar8 = (long)piVar7 - (long)Xc_ind >> 2;
      goto LAB_0016a69d;
    }
    if (*piVar7 <= (int)uVar10) break;
    puVar6 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                       (puVar6 + 1,puVar2,piVar7);
  } while( true );
  piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (piVar7 + 1,piVar1,puVar6);
  lVar8 = (long)piVar7 - (long)Xc_ind >> 2;
  goto LAB_0016a69d;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}